

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

char ** hts_readlines(char *fn,int *_n)

{
  int iVar1;
  BGZF *f;
  char *pcVar2;
  void *pvVar3;
  long lVar4;
  int local_78;
  int local_74;
  char *local_70;
  char *p;
  char *q;
  kstring_t str;
  kstream_t *ks;
  BGZF *fp;
  char **s;
  int local_28;
  int dret;
  int n;
  int m;
  int *_n_local;
  char *fn_local;
  
  dret = 0;
  local_28 = 0;
  fp = (BGZF *)0x0;
  _n = _n;
  _n_local = (int *)fn;
  f = bgzf_open(fn,"r");
  if (f == (BGZF *)0x0) {
    if ((char)*_n_local == ':') {
      local_70 = (char *)((long)_n_local + 1);
      p = local_70;
      do {
        if ((*local_70 == ',') || (*local_70 == '\0')) {
          if (dret == local_28) {
            if (dret == 0) {
              local_78 = 0x10;
            }
            else {
              local_78 = dret << 1;
            }
            dret = local_78;
            fp = (BGZF *)realloc(fp,(long)local_78 << 3);
          }
          pvVar3 = calloc((size_t)(local_70 + (1 - (long)p)),1);
          *(void **)(&fp->field_0x0 + (long)local_28 * 8) = pvVar3;
          lVar4 = (long)local_28;
          local_28 = local_28 + 1;
          strncpy(*(char **)(&fp->field_0x0 + lVar4 * 8),p,(long)local_70 - (long)p);
          p = local_70 + 1;
          if (*local_70 == '\0') goto LAB_0010d48f;
        }
        local_70 = local_70 + 1;
      } while( true );
    }
    fn_local = (char *)0x0;
  }
  else {
    str.m = 0;
    str.l = 0;
    q = (char *)0x0;
    str.s = (char *)ks_init(f);
    while (iVar1 = ks_getuntil((kstream_t *)str.s,2,(kstring_t *)&q,(int *)((long)&s + 4)),
          -1 < iVar1) {
      if (q != (char *)0x0) {
        if (dret == local_28) {
          if (dret == 0) {
            local_74 = 0x10;
          }
          else {
            local_74 = dret << 1;
          }
          dret = local_74;
          fp = (BGZF *)realloc(fp,(long)local_74 << 3);
        }
        pcVar2 = strdup((char *)str.m);
        *(char **)(&fp->field_0x0 + (long)local_28 * 8) = pcVar2;
        local_28 = local_28 + 1;
      }
    }
    ks_destroy((kstream_t *)str.s);
    bgzf_close(f);
    fp = (BGZF *)realloc(fp,(long)local_28 << 3);
    free((void *)str.m);
LAB_0010d48f:
    fn_local = (char *)realloc(fp,(long)local_28 << 3);
    *_n = local_28;
  }
  return (char **)fn_local;
}

Assistant:

char **hts_readlines(const char *fn, int *_n)
{
    int m = 0, n = 0, dret;
    char **s = 0;
#if KS_BGZF
    BGZF *fp = bgzf_open(fn, "r");
#else
    gzFile fp = gzopen(fn, "r");
#endif
    if ( fp ) { // read from file
        kstream_t *ks;
        kstring_t str;
        str.s = 0; str.l = str.m = 0;
        ks = ks_init(fp);
        while (ks_getuntil(ks, KS_SEP_LINE, &str, &dret) >= 0) {
            if (str.l == 0) continue;
            if (m == n) {
                m = m? m<<1 : 16;
                s = (char**)realloc(s, m * sizeof(char*));
            }
            s[n++] = strdup(str.s);
        }
        ks_destroy(ks);
        #if KS_BGZF
            bgzf_close(fp);
        #else
            gzclose(fp);
        #endif
        s = (char**)realloc(s, n * sizeof(char*));
        free(str.s);
    } else if (*fn == ':') { // read from string
        const char *q, *p;
        for (q = p = fn + 1;; ++p)
            if (*p == ',' || *p == 0) {
                if (m == n) {
                    m = m? m<<1 : 16;
                    s = (char**)realloc(s, m * sizeof(char*));
                }
                s[n] = (char*)calloc(p - q + 1, 1);
                strncpy(s[n++], q, p - q);
                q = p + 1;
                if (*p == 0) break;
            }
    } else return 0;
    s = (char**)realloc(s, n * sizeof(char*));
    *_n = n;
    return s;
}